

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O3

void __thiscall spdlog::async_logger::sink_it_(async_logger *this,log_msg *msg)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  thread_pool *this_01;
  _Atomic_word _Var2;
  bool bVar3;
  async_logger_ptr aaStack_a8 [5];
  string local_50;
  
  this_00 = (this->thread_pool_).
            super___weak_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var2 = this_00->_M_use_count;
    do {
      if (_Var2 == 0) goto LAB_0011bbc1;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar3 = _Var2 == iVar1;
      if (bVar3) {
        this_00->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar3);
    if ((this_00->_M_use_count != 0) &&
       (this_01 = (this->thread_pool_).
                  super___weak_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       this_01 != (thread_pool *)0x0)) {
      std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<spdlog::async_logger,void>
                ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)aaStack_a8,
                 (__weak_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<spdlog::async_logger>);
      details::thread_pool::post_log(this_01,aaStack_a8,msg,this->overflow_policy_);
      if (aaStack_a8[0].super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (aaStack_a8[0].
                   super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
LAB_0011bbc1:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"async log: thread pool doesn\'t exist anymore","");
  throw_spdlog_ex(&local_50);
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::sink_it_(const details::log_msg &msg){
    SPDLOG_TRY{if (auto pool_ptr = thread_pool_.lock()){
        pool_ptr->post_log(shared_from_this(), msg, overflow_policy_);
}
else {
    throw_spdlog_ex("async log: thread pool doesn't exist anymore");
}
}
SPDLOG_LOGGER_CATCH(msg.source)
}